

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

Memory * __thiscall
wasm::Module::addMemory
          (Module *this,unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr)

{
  Memory *pMVar1;
  string local_40;
  _Head_base<0UL,_wasm::Memory_*,_false> local_20;
  
  local_20._M_head_impl =
       (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
       super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
       super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl = (Memory *)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"addMemory","");
  pMVar1 = addModuleElement<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
                     (&this->memories,&this->memoriesMap,
                      (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_20,
                      &local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_20._M_head_impl != (Memory *)0x0) {
    operator_delete(local_20._M_head_impl,0x58);
  }
  return pMVar1;
}

Assistant:

Memory* Module::addMemory(std::unique_ptr<Memory>&& curr) {
  return addModuleElement(memories, memoriesMap, std::move(curr), "addMemory");
}